

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *dctx)

{
  ZSTD_DDict *pZVar1;
  long in_RDI;
  ZSTD_DDictHashSet *unaff_retaddr;
  ZSTD_DDict *frameDDict;
  
  if ((*(int *)(in_RDI + 0x7610) != 0) && (*(long *)(in_RDI + 0x7608) != 0)) {
    if ((*(long *)(in_RDI + 0x75f0) != 0) &&
       (pZVar1 = ZSTD_DDictHashSet_getDDict(unaff_retaddr,(U32)((ulong)in_RDI >> 0x20)),
       pZVar1 != (ZSTD_DDict *)0x0)) {
      ZSTD_clearDict((ZSTD_DCtx *)0x2f9189);
      *(undefined4 *)(in_RDI + 0x75f8) = *(undefined4 *)(in_RDI + 0x7504);
      *(ZSTD_DDict **)(in_RDI + 0x75f0) = pZVar1;
      *(undefined4 *)(in_RDI + 0x7600) = 0xffffffff;
    }
    return;
  }
  __assert_fail("dctx->refMultipleDDicts && dctx->ddictSet",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9cb1,"void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *)");
}

Assistant:

static void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx* dctx) {
    assert(dctx->refMultipleDDicts && dctx->ddictSet);
    DEBUGLOG(4, "Adjusting DDict based on requested dict ID from frame");
    if (dctx->ddict) {
        const ZSTD_DDict* frameDDict = ZSTD_DDictHashSet_getDDict(dctx->ddictSet, dctx->fParams.dictID);
        if (frameDDict) {
            DEBUGLOG(4, "DDict found!");
            ZSTD_clearDict(dctx);
            dctx->dictID = dctx->fParams.dictID;
            dctx->ddict = frameDDict;
            dctx->dictUses = ZSTD_use_indefinitely;
        }
    }
}